

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O0

void __thiscall WriteIncludesBase::acceptProperty(WriteIncludesBase *this,DomProperty *node)

{
  Kind KVar1;
  DomProperty *in_RSI;
  DomProperty *in_RDI;
  long in_FS_OFFSET;
  char16_t *str_2;
  char16_t *str;
  char16_t *str_1;
  QArrayDataPointer<char16_t> local_98 [2];
  DomCustomWidget *in_stack_ffffffffffffffa0;
  QString *in_stack_ffffffffffffffa8;
  WriteIncludesBase *in_stack_ffffffffffffffb0;
  QArrayDataPointer<char16_t> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  KVar1 = DomProperty::kind(in_RSI);
  if (KVar1 == Date) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_38,(Data *)0x0,L"QDate",5);
    QString::QString(&in_RSI->m_attr_name,(DataPointer *)in_RDI);
    add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    QString::~QString((QString *)0x197c77);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RSI);
  }
  KVar1 = DomProperty::kind(in_RSI);
  if (KVar1 == Locale) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98,(Data *)0x0,L"QLocale",7);
    QString::QString(&in_RSI->m_attr_name,(DataPointer *)in_RDI);
    add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    QString::~QString((QString *)0x197d0c);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RSI);
  }
  KVar1 = DomProperty::kind(in_RSI);
  if (KVar1 == IconSet) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_98,(Data *)0x0,L"QIcon",5);
    QString::QString(&in_RSI->m_attr_name,(DataPointer *)in_RDI);
    add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    QString::~QString((QString *)0x197d8b);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RSI);
  }
  TreeWalker::acceptProperty((TreeWalker *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptProperty(DomProperty *node)
{
    if (node->kind() == DomProperty::Date)
        add(QStringLiteral("QDate"));
    if (node->kind() == DomProperty::Locale)
        add(QStringLiteral("QLocale"));
    if (node->kind() == DomProperty::IconSet)
        add(QStringLiteral("QIcon"));
    TreeWalker::acceptProperty(node);
}